

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

bool __thiscall
el::Configurations::hasConfiguration
          (Configurations *this,Level level,ConfigurationType configurationType)

{
  int iVar1;
  undefined4 extraout_var;
  Configuration *pCVar2;
  NoScopedLock<el::base::threading::internal::NoMutex> local_20;
  ScopedLock scopedLock;
  ConfigurationType configurationType_local;
  Level level_local;
  Configurations *this_local;
  
  scopedLock._vptr_NoScopedLock._0_4_ = configurationType;
  scopedLock._vptr_NoScopedLock._4_4_ = level;
  iVar1 = (*(this->super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>).
            super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
            .super_ThreadSafe._vptr_ThreadSafe[2])();
  el::base::threading::internal::NoScopedLock<el::base::threading::internal::NoMutex>::NoScopedLock
            (&local_20,(NoMutex *)CONCAT44(extraout_var,iVar1));
  pCVar2 = el::base::utils::RegistryWithPred<el::Configuration,el::Configuration::Predicate>::
           get<el::Level,el::ConfigurationType>
                     ((RegistryWithPred<el::Configuration,el::Configuration::Predicate> *)this,
                      (Level *)((long)&scopedLock._vptr_NoScopedLock + 4),
                      (ConfigurationType)scopedLock._vptr_NoScopedLock);
  el::base::threading::internal::NoScopedLock<el::base::threading::internal::NoMutex>::~NoScopedLock
            (&local_20);
  return pCVar2 != (Configuration *)0x0;
}

Assistant:

bool Configurations::hasConfiguration(Level level, ConfigurationType configurationType) {
  base::threading::ScopedLock scopedLock(lock());
#if ELPP_COMPILER_INTEL
  // We cant specify template types here, Intel C++ throws compilation error
  // "error: type name is not allowed"
  return RegistryWithPred::get(level, configurationType) != nullptr;
#else
  return RegistryWithPred<Configuration, Configuration::Predicate>::get(level, configurationType) != nullptr;
#endif  // ELPP_COMPILER_INTEL
}